

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathLibrary.cpp
# Opt level: O2

void __thiscall UCrtC99MathApis::Ensure(UCrtC99MathApis *this)

{
  bool bVar1;
  PFNMathFn pFVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  if ((this->super_DelayLoadLibrary).m_isInit == false) {
    DelayLoadLibrary::EnsureFromSystemDirOnly(&this->super_DelayLoadLibrary);
    bVar1 = IsAvailable(this);
    if (bVar1) {
      pFVar2 = (PFNMathFn)DelayLoadLibrary::GetFunction(&this->super_DelayLoadLibrary,"log2");
      this->m_pfnlog2 = pFVar2;
      pFVar2 = (PFNMathFn)DelayLoadLibrary::GetFunction(&this->super_DelayLoadLibrary,"log1p");
      this->m_pfnlog1p = pFVar2;
      pFVar2 = (PFNMathFn)DelayLoadLibrary::GetFunction(&this->super_DelayLoadLibrary,"expm1");
      this->m_pfnexpm1 = pFVar2;
      pFVar2 = (PFNMathFn)DelayLoadLibrary::GetFunction(&this->super_DelayLoadLibrary,"acosh");
      this->m_pfnacosh = pFVar2;
      pFVar2 = (PFNMathFn)DelayLoadLibrary::GetFunction(&this->super_DelayLoadLibrary,"asinh");
      this->m_pfnasinh = pFVar2;
      pFVar2 = (PFNMathFn)DelayLoadLibrary::GetFunction(&this->super_DelayLoadLibrary,"atanh");
      this->m_pfnatanh = pFVar2;
      pFVar2 = (PFNMathFn)DelayLoadLibrary::GetFunction(&this->super_DelayLoadLibrary,"trunc");
      this->m_pfntrunc = pFVar2;
      pFVar2 = (PFNMathFn)DelayLoadLibrary::GetFunction(&this->super_DelayLoadLibrary,"cbrt");
      this->m_pfncbrt = pFVar2;
      auVar5._0_8_ = -(ulong)(this->m_pfnexpm1 == (PFNMathFn)0x0);
      auVar5._8_8_ = -(ulong)(this->m_pfnacosh == (PFNMathFn)0x0);
      auVar3._0_8_ = -(ulong)(this->m_pfnlog2 == (PFNMathFn)0x0);
      auVar3._8_8_ = -(ulong)(this->m_pfnlog1p == (PFNMathFn)0x0);
      auVar3 = packssdw(auVar3,auVar5);
      auVar4._0_8_ = -(ulong)(this->m_pfnasinh == (PFNMathFn)0x0);
      auVar4._8_8_ = -(ulong)(this->m_pfnatanh == (PFNMathFn)0x0);
      auVar6._0_8_ = -(ulong)(this->m_pfntrunc == (PFNMathFn)0x0);
      auVar6._8_8_ = -(ulong)(pFVar2 == (PFNMathFn)0x0);
      auVar5 = packssdw(auVar4,auVar6);
      auVar3 = packssdw(auVar3,auVar5);
      if ((((((((((((((((auVar3 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar3 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar3 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar3 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar3 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar3 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar3 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar3 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar3 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar3 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar3 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar3 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar3 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar3 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar3 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar3[0xf] < '\0')
      {
        FreeLibrary((this->super_DelayLoadLibrary).m_hModule);
        (this->super_DelayLoadLibrary).m_hModule = (HMODULE)0x0;
      }
    }
  }
  return;
}

Assistant:

void UCrtC99MathApis::Ensure()
{
    if (m_isInit)
    {
        return;
    }

    DelayLoadLibrary::EnsureFromSystemDirOnly();

    if (IsAvailable())
    {
        m_pfnlog2  = (PFNMathFn)GetFunction("log2");
        m_pfnlog1p = (PFNMathFn)GetFunction("log1p");
        m_pfnexpm1 = (PFNMathFn)GetFunction("expm1");
        m_pfnacosh = (PFNMathFn)GetFunction("acosh");
        m_pfnasinh = (PFNMathFn)GetFunction("asinh");
        m_pfnatanh = (PFNMathFn)GetFunction("atanh");
        m_pfntrunc = (PFNMathFn)GetFunction("trunc");
        m_pfncbrt  = (PFNMathFn)GetFunction("cbrt");

        if (m_pfnlog2 == nullptr ||
            m_pfnlog1p == nullptr ||
            m_pfnexpm1 == nullptr ||
            m_pfnacosh == nullptr ||
            m_pfnasinh == nullptr ||
            m_pfnatanh == nullptr ||
            m_pfntrunc == nullptr ||
            m_pfncbrt == nullptr)
        {
            // If any of the APIs fail to load then presume the entire module is bogus and free it
            FreeLibrary(m_hModule);
            m_hModule = nullptr;
        }
    }
}